

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ostream_iterator<char,_char,_std::char_traits<char>_>
fmt::v5::internal::
format_decimal<char,unsigned_int,std::ostream_iterator<char,char,std::char_traits<char>>,fmt::v5::internal::no_thousands_sep>
          (ostream_type *param_1,ostream_iterator<char,_char,_std::char_traits<char>_> *param_2,
          undefined4 param_3,undefined4 param_4)

{
  char *begin;
  type tVar1;
  ostream_iterator<char,_char,_std::char_traits<char>_> oVar2;
  char *end;
  char_type buffer [13];
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined1 local_2d [13];
  undefined4 local_20;
  undefined4 local_1c;
  ostream_iterator<char,_char,_std::char_traits<char>_> *local_18;
  ostream_type *local_8;
  
  local_20 = param_4;
  local_1c = param_3;
  local_18 = param_2;
  local_8 = param_1;
  begin = format_decimal<unsigned_int,char,fmt::v5::internal::no_thousands_sep>
                    (local_2d,param_3,param_4);
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator
            ((ostream_iterator<char,_char,_std::char_traits<char>_> *)&stack0xffffffffffffffb0,
             param_2);
  tVar1 = copy_str<char,char*,std::ostream_iterator<char,char,std::char_traits<char>>>
                    (begin,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  oVar2._M_string = tVar1._M_string;
  oVar2._M_stream = param_1;
  return oVar2;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}